

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  NodeRef *pNVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  size_t sVar6;
  _func_int **pp_Var7;
  size_t i_1;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  NodeRef *pNVar12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar13;
  size_t sVar14;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar15;
  undefined1 auVar16 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [64];
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar18;
  undefined1 auVar19 [16];
  vint4 ai;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar22;
  vint4 ai_1;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vint4 ai_3;
  undefined1 auVar25 [16];
  vint4 bi;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vint4 bi_1;
  undefined1 auVar28 [16];
  vint4 bi_3;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 bi_2;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  vint4 bi_8;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  RTCIntersectFunctionNArguments local_17c0;
  Geometry *local_1790;
  undefined8 local_1788;
  RTCIntersectArguments *local_1780;
  undefined1 local_1778 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1768;
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar19 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar19 = vpcmpeqd_avx(auVar19,(undefined1  [16])valid_i->field_0);
    if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar19[0xf] < '\0')
    {
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar5 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar26);
      auVar29._8_4_ = 0x219392ef;
      auVar29._0_8_ = 0x219392ef219392ef;
      auVar29._12_4_ = 0x219392ef;
      auVar5 = vcmpps_avx(auVar5,auVar29,1);
      auVar20 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar29,auVar5);
      auVar5 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar26);
      auVar5 = vcmpps_avx(auVar5,auVar29,1);
      auVar21 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar29,auVar5);
      auVar5 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar26);
      auVar5 = vcmpps_avx(auVar5,auVar29,1);
      auVar5 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar29,auVar5);
      auVar26 = vrcpps_avx(auVar20);
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar29 = vfnmadd213ps_fma(auVar20,auVar26,auVar23);
      auVar20 = vrcpps_avx(auVar21);
      auVar24 = vfnmadd213ps_fma(auVar21,auVar20,auVar23);
      auVar21 = vrcpps_avx(auVar5);
      auVar5 = vfnmadd213ps_fma(auVar5,auVar21,auVar23);
      local_1738 = vfmadd132ps_fma(auVar29,auVar26,auVar26);
      auVar31 = ZEXT1664(local_1738);
      local_1748 = vfmadd132ps_fma(auVar24,auVar20,auVar20);
      auVar32 = ZEXT1664(local_1748);
      local_1758 = vfmadd132ps_fma(auVar5,auVar21,auVar21);
      auVar33 = ZEXT1664(local_1758);
      auVar5 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar34 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      local_1768.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar5,auVar19);
      auVar35 = ZEXT1664((undefined1  [16])local_1768);
      auVar5 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      auVar20._8_4_ = 0xff800000;
      auVar20._0_8_ = 0xff800000ff800000;
      auVar20._12_4_ = 0xff800000;
      auVar19 = vblendvps_avx(auVar20,auVar5,auVar19);
      auVar36 = ZEXT1664(auVar19);
      pNVar12 = stack_node + 2;
      paVar13 = &stack_near[2].field_0;
      auVar19 = *(undefined1 (*) [16])(ray + 0x10);
      local_1778._0_4_ = local_1738._0_4_ * -*(float *)ray;
      local_1778._4_4_ = local_1738._4_4_ * -*(float *)(ray + 4);
      local_1778._8_4_ = local_1738._8_4_ * -*(float *)(ray + 8);
      local_1778._12_4_ = local_1738._12_4_ * -*(float *)(ray + 0xc);
      auVar37 = ZEXT1664(local_1778);
      local_16f8 = local_1748._0_4_ * -auVar19._0_4_;
      fStack_16f4 = local_1748._4_4_ * -auVar19._4_4_;
      fStack_16f0 = local_1748._8_4_ * -auVar19._8_4_;
      fStack_16ec = local_1748._12_4_ * -auVar19._12_4_;
      local_1708 = local_1758._0_4_ * -*(float *)(ray + 0x20);
      fStack_1704 = local_1758._4_4_ * -*(float *)(ray + 0x24);
      fStack_1700 = local_1758._8_4_ * -*(float *)(ray + 0x28);
      fStack_16fc = local_1758._12_4_ * -*(float *)(ray + 0x2c);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = local_1768;
LAB_0155b3f8:
      pNVar2 = pNVar12 + -1;
      if (pNVar2->ptr != 0xfffffffffffffff8) {
        pNVar12 = pNVar12 + -1;
        paVar1 = paVar13 + -1;
        auVar17 = ZEXT1664((undefined1  [16])*paVar1);
        paVar13 = paVar13 + -1;
        local_1718 = auVar36._0_16_;
        auVar19 = vcmpps_avx((undefined1  [16])*paVar1,local_1718,1);
        sVar14 = pNVar2->ptr;
        if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar19[0xf] < '\0') {
          while ((sVar14 & 8) == 0) {
            auVar17 = ZEXT1664(auVar34._0_16_);
            uVar11 = 0;
            sVar6 = 8;
            for (lVar8 = 0;
                (lVar8 != 4 &&
                (sVar10 = *(size_t *)((sVar14 & 0xfffffffffffffff0) + lVar8 * 8), sVar10 != 8));
                lVar8 = lVar8 + 1) {
              uVar3 = *(undefined4 *)(sVar14 + 0x20 + lVar8 * 4);
              auVar21._4_4_ = uVar3;
              auVar21._0_4_ = uVar3;
              auVar21._8_4_ = uVar3;
              auVar21._12_4_ = uVar3;
              auVar20 = vfmadd213ps_fma(auVar21,auVar31._0_16_,auVar37._0_16_);
              uVar3 = *(undefined4 *)(sVar14 + 0x40 + lVar8 * 4);
              auVar24._4_4_ = uVar3;
              auVar24._0_4_ = uVar3;
              auVar24._8_4_ = uVar3;
              auVar24._12_4_ = uVar3;
              auVar5._4_4_ = fStack_16f4;
              auVar5._0_4_ = local_16f8;
              auVar5._8_4_ = fStack_16f0;
              auVar5._12_4_ = fStack_16ec;
              auVar21 = vfmadd213ps_fma(auVar24,auVar32._0_16_,auVar5);
              uVar3 = *(undefined4 *)(sVar14 + 0x60 + lVar8 * 4);
              auVar25._4_4_ = uVar3;
              auVar25._0_4_ = uVar3;
              auVar25._8_4_ = uVar3;
              auVar25._12_4_ = uVar3;
              auVar19._4_4_ = fStack_1704;
              auVar19._0_4_ = local_1708;
              auVar19._8_4_ = fStack_1700;
              auVar19._12_4_ = fStack_16fc;
              auVar26 = vfmadd213ps_fma(auVar25,auVar33._0_16_,auVar19);
              uVar3 = *(undefined4 *)(sVar14 + 0x30 + lVar8 * 4);
              auVar27._4_4_ = uVar3;
              auVar27._0_4_ = uVar3;
              auVar27._8_4_ = uVar3;
              auVar27._12_4_ = uVar3;
              auVar29 = vfmadd213ps_fma(auVar27,auVar31._0_16_,auVar37._0_16_);
              uVar3 = *(undefined4 *)(sVar14 + 0x50 + lVar8 * 4);
              auVar28._4_4_ = uVar3;
              auVar28._0_4_ = uVar3;
              auVar28._8_4_ = uVar3;
              auVar28._12_4_ = uVar3;
              auVar24 = vfmadd213ps_fma(auVar28,auVar32._0_16_,auVar5);
              uVar3 = *(undefined4 *)(sVar14 + 0x70 + lVar8 * 4);
              auVar30._4_4_ = uVar3;
              auVar30._0_4_ = uVar3;
              auVar30._8_4_ = uVar3;
              auVar30._12_4_ = uVar3;
              auVar23 = vfmadd213ps_fma(auVar30,auVar33._0_16_,auVar19);
              auVar19 = vpminsd_avx(auVar20,auVar29);
              auVar5 = vpminsd_avx(auVar21,auVar24);
              auVar19 = vpmaxsd_avx(auVar19,auVar5);
              auVar5 = vpminsd_avx(auVar26,auVar23);
              auVar5 = vpmaxsd_avx(auVar19,auVar5);
              auVar19 = vpmaxsd_avx(auVar20,auVar29);
              auVar20 = vpmaxsd_avx(auVar21,auVar24);
              auVar21 = vpminsd_avx(auVar19,auVar20);
              auVar19 = vpmaxsd_avx(auVar26,auVar23);
              auVar20 = vpmaxsd_avx(auVar5,auVar35._0_16_);
              auVar19 = vpminsd_avx(auVar19,local_1718);
              auVar19 = vpminsd_avx(auVar21,auVar19);
              auVar19 = vcmpps_avx(auVar20,auVar19,2);
              if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar19[0xf] < '\0') {
                aVar22 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar34._0_16_,auVar5,auVar19);
                aVar15 = auVar17._0_16_;
                auVar19 = vcmpps_avx((undefined1  [16])aVar22,(undefined1  [16])aVar15,1);
                sVar9 = sVar6;
                aVar18 = aVar22;
                if (((((auVar19 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar19 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar19 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar19[0xf]) ||
                   (sVar9 = sVar10, sVar10 = sVar6, aVar18 = aVar15, aVar15 = aVar22, sVar6 != 8)) {
                  aVar22 = aVar15;
                  uVar11 = uVar11 + 1;
                  pNVar12->ptr = sVar10;
                  pNVar12 = pNVar12 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar13->v = aVar18;
                  paVar13 = paVar13 + 1;
                }
                sVar6 = sVar9;
                auVar17 = ZEXT1664((undefined1  [16])aVar22);
              }
            }
            if (sVar6 == 8) goto LAB_0155b3f8;
            sVar14 = sVar6;
            if (1 < uVar11) {
              aVar22 = paVar13[-2];
              aVar18 = paVar13[-1];
              auVar19 = vcmpps_avx((undefined1  [16])aVar22,(undefined1  [16])aVar18,1);
              aVar15 = aVar18;
              if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar19[0xf] < '\0') {
                paVar13[-2] = aVar18;
                paVar13[-1] = aVar22;
                auVar19 = vpermilps_avx(*(undefined1 (*) [16])(pNVar12 + -2),0x4e);
                *(undefined1 (*) [16])(pNVar12 + -2) = auVar19;
                aVar15 = aVar22;
                aVar22 = aVar18;
              }
              if (uVar11 != 2) {
                aVar18 = paVar13[-3];
                auVar19 = vcmpps_avx((undefined1  [16])aVar18,(undefined1  [16])aVar15,1);
                if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar19[0xf] < '\0') {
                  paVar13[-3] = aVar15;
                  paVar13[-1] = aVar18;
                  sVar6 = pNVar12[-3].ptr;
                  pNVar12[-3].ptr = pNVar12[-1].ptr;
                  pNVar12[-1].ptr = sVar6;
                  aVar18 = aVar15;
                }
                auVar19 = vcmpps_avx((undefined1  [16])aVar18,(undefined1  [16])aVar22,1);
                if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar19[0xf] < '\0') {
                  paVar13[-3] = aVar22;
                  paVar13[-2] = aVar18;
                  auVar19 = vpermilps_avx(*(undefined1 (*) [16])(pNVar12 + -3),0x4e);
                  *(undefined1 (*) [16])(pNVar12 + -3) = auVar19;
                }
              }
            }
          }
          if (sVar14 == 0xfffffffffffffff8) {
            return;
          }
          local_1728 = vcmpps_avx(local_1718,auVar17._0_16_,6);
          auVar17 = ZEXT1664(local_1728);
          if ((((local_1728 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_1728 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_1728 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_1728[0xf] < '\0') {
            for (lVar8 = 0; auVar19 = auVar17._0_16_, (ulong)((uint)sVar14 & 0xf) - 8 != lVar8;
                lVar8 = lVar8 + 1) {
              local_17c0.geomID = *(uint *)((sVar14 & 0xfffffffffffffff0) + lVar8 * 8);
              local_1790 = (context->scene->geometries).items[local_17c0.geomID].ptr;
              uVar4 = local_1790->mask;
              auVar16._4_4_ = uVar4;
              auVar16._0_4_ = uVar4;
              auVar16._8_4_ = uVar4;
              auVar16._12_4_ = uVar4;
              auVar5 = vpand_avx(auVar16,*(undefined1 (*) [16])(ray + 0x90));
              auVar5 = vpcmpeqd_avx(auVar5,_DAT_01f45a50);
              auVar20 = auVar19 & ~auVar5;
              if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar20[0xf] < '\0') {
                mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                               vandnps_avx(auVar5,auVar19);
                local_17c0.primID = *(uint *)((sVar14 & 0xfffffffffffffff0) + 4 + lVar8 * 8);
                local_17c0.valid = (int *)&mask;
                local_17c0.geometryUserPtr = local_1790->userPtr;
                local_17c0.context = context->user;
                local_17c0.N = 4;
                local_1788 = 0;
                local_1780 = context->args;
                pp_Var7 = (_func_int **)local_1780->intersect;
                if (pp_Var7 == (_func_int **)0x0) {
                  pp_Var7 = local_1790[1].super_RefCount._vptr_RefCount;
                }
                local_17c0.rayhit = (RTCRayHitN *)ray;
                (*(code *)pp_Var7)(&local_17c0);
                auVar31 = ZEXT1664(local_1738);
                auVar32 = ZEXT1664(local_1748);
                auVar33 = ZEXT1664(local_1758);
                auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar35 = ZEXT1664((undefined1  [16])local_1768);
                auVar36 = ZEXT1664(local_1718);
                auVar37 = ZEXT1664(local_1778);
                auVar17 = ZEXT1664(local_1728);
              }
            }
            auVar19 = vblendvps_avx(auVar36._0_16_,*(undefined1 (*) [16])(ray + 0x80),auVar19);
            auVar36 = ZEXT1664(auVar19);
          }
        }
        goto LAB_0155b3f8;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }